

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::ShaderBindingTableVkImpl,_Diligent::FixedBlockMemoryAllocator>::
DestroyObject(ObjectWrapper<Diligent::ShaderBindingTableVkImpl,_Diligent::FixedBlockMemoryAllocator>
              *this)

{
  ShaderBindingTableVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this->m_pAllocator != (FixedBlockMemoryAllocator *)0x0) {
    ShaderBindingTableVkImpl::~ShaderBindingTableVkImpl(this_00);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
    return;
  }
  if (this_00 != (ShaderBindingTableVkImpl *)0x0) {
    ShaderBindingTableVkImpl::~ShaderBindingTableVkImpl(this_00);
    free(this_00);
    return;
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }